

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  _Bool _Var1;
  char *pcVar2;
  
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;
  if (source->CApath == (char *)0x0) {
    dest->CApath = (char *)0x0;
LAB_0014ade3:
    if (source->CAfile == (char *)0x0) {
      dest->CAfile = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->CAfile);
      dest->CAfile = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0014ae95;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0014ae95;
    }
    if (source->random_file == (char *)0x0) {
      dest->random_file = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->random_file);
      dest->random_file = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0014ae95;
    }
    if (source->egdsocket == (char *)0x0) {
      dest->egdsocket = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->egdsocket);
      dest->egdsocket = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0014ae95;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0014ae95;
    }
    _Var1 = true;
  }
  else {
    pcVar2 = (*Curl_cstrdup)(source->CApath);
    dest->CApath = pcVar2;
    if (pcVar2 != (char *)0x0) goto LAB_0014ade3;
LAB_0014ae95:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;

  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(clientcert);
  CLONE_STRING(random_file);
  CLONE_STRING(egdsocket);
  CLONE_STRING(cipher_list);

  return TRUE;
}